

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wchar.cpp
# Opt level: O2

int PAL_wmemcmp(char16_t *string1,char16_t *string2,size_t count)

{
  char16_t *pcVar1;
  char16_t *pcVar2;
  ulong uVar3;
  int iVar4;
  ulong uVar5;
  
  if (!PAL_InitializeChakraCoreCalled) {
    abort();
  }
  if (string1 == string2) {
LAB_0031294a:
    iVar4 = 0;
  }
  else {
    uVar3 = 0;
    do {
      uVar5 = uVar3;
      if (count <= uVar5 + 4) break;
      uVar3 = uVar5 + 4;
    } while (*(long *)(string1 + uVar5) == *(long *)(string2 + uVar5));
    do {
      if (count <= uVar5) goto LAB_0031294a;
      pcVar1 = string1 + uVar5;
      pcVar2 = string2 + uVar5;
      uVar5 = uVar5 + 1;
      iVar4 = (uint)(ushort)*pcVar1 - (uint)(ushort)*pcVar2;
    } while (iVar4 == 0);
  }
  return iVar4;
}

Assistant:

int
__cdecl
PAL_wmemcmp(
        const char16_t *string1,
        const char16_t *string2,
        size_t count)
{
    size_t i, wi = 0;
    int diff = 0;

    PERF_ENTRY(wmemcmp);
    ENTRY("wmemcmp (string1=%p (%S), string2=%p (%S) count=%lu)\n",
          string1?string1:W16_NULLSTRING,
          string1?string1:W16_NULLSTRING, string2?string2:W16_NULLSTRING, string2?string2:W16_NULLSTRING,
          (unsigned long) count);

    if (string1 == string2) return diff;

    constexpr size_t blockSize = sizeof(size_t) / sizeof(char16_t);
    const     size_t *num1     = (const size_t*)(string1);
    const     size_t *num2     = (const size_t*)(string2);

    while( (count > blockSize * (wi + 1)) && num1[wi] == num2[wi] ) ++wi;

    for (i = blockSize * wi; i < count; ++i)
    {
        diff = string1[i] - string2[i];
        if (diff != 0)
        {
            break;
        }
    }

    LOGEXIT("wmemcmp returning int %d\n", diff);
    PERF_EXIT(wmemcmp);
    return diff;
}